

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

void __thiscall WorldShuffler::randomize_fox_hints(WorldShuffler *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  RandomizerOptions *pRVar9;
  HintSource *hint_source_00;
  undefined1 auVar10 [14];
  unkuint10 Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  ushort uVar15;
  __normal_iterator<HintSource_*const_*,_std::vector<HintSource_*,_std::allocator<HintSource_*>_>_>
  _Var16;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ushort uVar19;
  ulong __new_size;
  ushort uVar20;
  pointer ppHVar21;
  pointer ppHVar22;
  undefined1 auVar23 [16];
  HintSource *hint_source;
  vector<HintSource_*,_std::allocator<HintSource_*>_> foxes_pool;
  undefined1 local_120 [32];
  uint local_100;
  uint local_fc;
  vector<HintSource_*,_std::allocator<HintSource_*>_> local_f8;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar9 = this->_options;
  uVar19 = (ushort)pRVar9->_hints_distribution_item_requirement;
  local_fc = (uint)pRVar9->_hints_distribution_region_requirement;
  uVar20 = (ushort)pRVar9->_hints_distribution_dark_region;
  local_100 = (uint)pRVar9->_hints_distribution_item_location;
  uVar15 = (ushort)pRVar9->_hints_distribution_joke;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppHVar21 = (this->_world->_hint_sources).
             super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppHVar22 = (this->_world->_hint_sources).
             super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppHVar21 != ppHVar22) {
    do {
      local_120._0_8_ = *ppHVar21;
      _Var16 = std::
               __find_if<__gnu_cxx::__normal_iterator<HintSource*const*,std::vector<HintSource*,std::allocator<HintSource*>>>,__gnu_cxx::__ops::_Iter_equals_val<HintSource*const>>
                         ((this->_world->_used_hint_sources).
                          super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->_world->_used_hint_sources).
                          super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,local_120);
      if ((_Var16._M_current ==
           (this->_world->_used_hint_sources).
           super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         ((((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_120._0_8_ + 0x70))->
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_start != *(pointer *)(local_120._0_8_ + 0x78))) {
        std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                  ((vector<HintSource*,std::allocator<HintSource*>> *)&local_f8,
                   (HintSource **)local_120);
      }
      ppHVar21 = ppHVar21 + 1;
    } while (ppHVar21 != ppHVar22);
  }
  vectools::shuffle<HintSource*>(&local_f8,&this->_rng);
  pRVar9 = this->_options;
  uVar1 = pRVar9->_hints_distribution_region_requirement;
  uVar3 = pRVar9->_hints_distribution_item_requirement;
  uVar5 = pRVar9->_hints_distribution_item_location;
  uVar7 = pRVar9->_hints_distribution_dark_region;
  __new_size = (ulong)(ushort)((ushort)(byte)uVar7 + (ushort)(byte)uVar3 +
                              (ushort)(byte)uVar5 + (ushort)(byte)uVar1) +
               (ulong)pRVar9->_hints_distribution_joke;
  if (__new_size <=
      (ulong)((long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl
                    .super__Vector_impl_data._M_start >> 3)) {
    std::vector<HintSource_*,_std::allocator<HintSource_*>_>::resize(&local_f8,__new_size);
    if (local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_d8 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppHVar21 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppHVar22 = local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      do {
        hint_source_00 = *ppHVar21;
        local_120._0_8_ = hint_source_00;
        std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                  ((vector<HintSource*,std::allocator<HintSource*>> *)
                   &this->_world->_used_hint_sources,(HintSource **)local_120);
        if ((uVar20 == 0) || (bVar14 = generate_dark_region_hint(this,hint_source_00), !bVar14)) {
          if ((uVar19 == 0) ||
             (bVar14 = generate_item_requirement_hint(this,hint_source_00), !bVar14)) {
            if (((short)local_fc == 0) ||
               (bVar14 = generate_region_requirement_hint(this,hint_source_00), !bVar14)) {
              if (((short)local_100 == 0) ||
                 (bVar14 = generate_item_location_hint(this,hint_source_00), !bVar14)) {
                if (uVar15 == 0) {
                  local_120._0_8_ = local_120 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_120,"I was meant to say something but... I forgot.","")
                  ;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(&hint_source_00->_text,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120);
                  if ((HintSource *)local_120._0_8_ != (HintSource *)(local_120 + 0x10)) {
                    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
                  }
                  uVar15 = 0;
                  ppHVar22 = local_d8;
                }
                else {
                  local_120._0_8_ = local_120 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_120,"I don\'t have anything to tell you. Move on.","");
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(&hint_source_00->_text,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120);
                  if ((HintSource *)local_120._0_8_ != (HintSource *)(local_120 + 0x10)) {
                    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
                  }
                  uVar15 = uVar15 - 1;
                  ppHVar22 = local_d8;
                }
              }
              else {
                local_100 = local_100 - 1;
              }
            }
            else {
              local_fc = local_fc - 1;
            }
          }
          else {
            uVar19 = uVar19 - 1;
          }
        }
        else {
          uVar20 = uVar20 - 1;
        }
        ppHVar21 = ppHVar21 + 1;
      } while (ppHVar21 != ppHVar22);
    }
    if (local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  pRVar9 = this->_options;
  uVar2 = pRVar9->_hints_distribution_region_requirement;
  uVar4 = pRVar9->_hints_distribution_item_requirement;
  uVar6 = pRVar9->_hints_distribution_item_location;
  uVar8 = pRVar9->_hints_distribution_dark_region;
  auVar23[3] = uVar8;
  auVar23[2] = uVar6;
  auVar23[1] = uVar4;
  auVar23[0] = uVar2;
  Var11 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar8);
  auVar13._10_6_ = 0;
  auVar13._0_10_ = Var11;
  auVar23._5_11_ = SUB1611(auVar13 << 0x30,5);
  auVar23[4] = uVar6;
  auVar12._12_4_ = 0;
  auVar12._0_12_ = auVar23._4_12_;
  auVar10._1_13_ = SUB1613(auVar12 << 0x20,3);
  auVar10[0] = uVar4;
  std::__cxx11::to_string
            (&local_b0,
             (uint)(ushort)((short)Var11 + auVar10._0_2_ + auVar23._4_2_ + (ushort)(byte)uVar2) +
             (uint)pRVar9->_hints_distribution_joke);
  std::operator+(&local_70,"Hints count (",&local_b0);
  pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_70,") is bigger than foxes pool size (");
  local_d0._M_dataplus._M_p = (pbVar17->_M_dataplus)._M_p;
  paVar18 = &pbVar17->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar18) {
    local_d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar17->_M_string_length;
  (pbVar17->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar17->_M_string_length = 0;
  (pbVar17->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_90,
             (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_50,&local_d0,&local_90);
  pbVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_50,").");
  local_120._0_8_ = (pbVar17->_M_dataplus)._M_p;
  paVar18 = &pbVar17->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ == paVar18) {
    local_120._16_8_ = paVar18->_M_allocated_capacity;
    local_120._24_8_ = *(undefined8 *)((long)&pbVar17->field_2 + 8);
    local_120._0_8_ = (HintSource *)(local_120 + 0x10);
  }
  else {
    local_120._16_8_ = paVar18->_M_allocated_capacity;
  }
  local_120._8_8_ = pbVar17->_M_string_length;
  (pbVar17->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar17->_M_string_length = 0;
  (pbVar17->field_2)._M_local_buf[0] = '\0';
  LandstalkerException::LandstalkerException(this_00,(string *)local_120);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void WorldShuffler::randomize_fox_hints()
{
    uint16_t remaining_item_requirement_hints = _options.hints_distribution_item_requirement();
    uint16_t remaining_region_requirement_hints = _options.hints_distribution_region_requirement();
    uint16_t remaining_dark_region_hints = _options.hints_distribution_dark_region();
    uint16_t remaining_item_location_hints = _options.hints_distribution_item_location();
    uint16_t remaining_joke_hints = _options.hints_distribution_joke();

    std::vector<HintSource*> foxes_pool;
    for(HintSource* hint_source : _world.hint_sources())
    {
        if(std::find(_world.used_hint_sources().begin(), _world.used_hint_sources().end(), hint_source) != _world.used_hint_sources().end())
            continue;
        if(hint_source->special())
            continue;

        foxes_pool.emplace_back(hint_source);
    }

    vectools::shuffle(foxes_pool, _rng);

    if(_options.hints_count() > foxes_pool.size())
    {
        throw LandstalkerException("Hints count (" + std::to_string(_options.hints_count())
                                   + ") is bigger than foxes pool size (" + std::to_string(foxes_pool.size()) +").");
    }
    foxes_pool.resize(_options.hints_count());

    // Put hints inside
    for(HintSource* hint_source : foxes_pool)
    {
        _world.add_used_hint_source(hint_source);

        if(remaining_dark_region_hints > 0)
        {
            if(this->generate_dark_region_hint(hint_source))
            {
                remaining_dark_region_hints--;
                continue;
            }
        }
        if(remaining_item_requirement_hints > 0)
        {
            if(this->generate_item_requirement_hint(hint_source))
            {
                remaining_item_requirement_hints--;
                continue;
            }
        }
        if(remaining_region_requirement_hints > 0)
        {
            if(this->generate_region_requirement_hint(hint_source))
            {
                remaining_region_requirement_hints--;
                continue;
            }
        }
        if(remaining_item_location_hints > 0)
        {
            if(this->generate_item_location_hint(hint_source))
            {
                remaining_item_location_hints--;
                continue;
            }
        }
        if(remaining_joke_hints > 0)
        {
            hint_source->text("I don't have anything to tell you. Move on.");
            remaining_joke_hints--;
            continue;
        }

        // Fallback if none of the options above were matching
        hint_source->text("I was meant to say something but... I forgot.");
    }
}